

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-syscalls.c
# Opt level: O0

int uv__statx(int dirfd,char *path,int flags,uint mask,uv__statx *statxbuf)

{
  long lVar1;
  uv__statx *statxbuf_local;
  uint mask_local;
  int flags_local;
  char *path_local;
  int dirfd_local;
  
  lVar1 = syscall(0x14c,(ulong)(uint)dirfd,path,(ulong)(uint)flags,(ulong)mask,statxbuf);
  return (int)lVar1;
}

Assistant:

int uv__statx(int dirfd,
              const char* path,
              int flags,
              unsigned int mask,
              struct uv__statx* statxbuf) {
  /* __NR_statx make Android box killed by SIGSYS.
   * That looks like a seccomp2 sandbox filter rejecting the system call.
   */
#if defined(__NR_statx) && !defined(__ANDROID__)
  return syscall(__NR_statx, dirfd, path, flags, mask, statxbuf);
#else
  return errno = ENOSYS, -1;
#endif
}